

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_list(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  lys_module *plVar2;
  ulong uVar3;
  bool bVar4;
  lysp_node **pplVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  long *plVar8;
  lysp_ext_instance *plVar9;
  char *pcVar10;
  ushort **ppuVar11;
  lysc_node *plVar12;
  lysc_node *plVar13;
  int iVar14;
  lysc_node *plVar15;
  LY_VECODE code;
  lysc_node **pplVar16;
  long lVar17;
  lysp_restr *must_p;
  ly_ctx *plVar18;
  lysp_node *plVar19;
  size_t name_len;
  lysp_ext_instance *plVar20;
  lysp_node *plVar21;
  LY_ERR unaff_R15D;
  
  iVar14._0_2_ = pnode[2].nodetype;
  iVar14._2_2_ = pnode[2].flags;
  *(int *)&node[1].dsc = iVar14;
  if (iVar14 != 0) {
    *(byte *)&node->flags = (byte)node->flags | 0x20;
  }
  *(uint *)((long)&node[1].dsc + 4) =
       -(uint)(*(uint *)&pnode[2].field_0xc == 0) | *(uint *)&pnode[2].field_0xc;
  for (plVar19 = (lysp_node *)pnode[1].ref; plVar19 != (lysp_node *)0x0; plVar19 = plVar19->next) {
    LVar7 = lys_compile_node(ctx,plVar19,node,0,(ly_set *)0x0);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
  }
  plVar19 = pnode[1].parent;
  if (plVar19 != (lysp_node *)0x0) {
    plVar2 = node[1].module;
    if (plVar2 == (lys_module *)0x0) {
      lVar17 = 0;
      plVar8 = (long *)calloc(1,(long)plVar19[-1].exts * 0x38 + 8);
    }
    else {
      lVar17 = *(long *)&plVar2[-1].implemented;
      plVar8 = (long *)realloc(&plVar2[-1].implemented,
                               ((long)&(plVar19[-1].exts)->name +
                               *(long *)&plVar2[-1].implemented + lVar17) * 0x38 + 8);
    }
    if (plVar8 == (long *)0x0) {
      bVar4 = false;
      LVar7 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      iVar14 = 5;
    }
    else {
      node[1].module = (lys_module *)(plVar8 + 1);
      LVar7 = LY_SUCCESS;
      if (pnode[1].parent == (lysp_node *)0x0) {
        plVar20 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar20 = pnode[1].parent[-1].exts;
      }
      memset(plVar8 + *plVar8 * 7 + 1,0,((long)&plVar20->name + lVar17) * 0x38);
      bVar4 = true;
      iVar14 = 0;
    }
    if (bVar4) {
      plVar20 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar17 = 0;
      LVar6 = LVar7;
      do {
        LVar7 = LVar6;
        plVar19 = pnode[1].parent;
        if (plVar19 == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar19[-1].exts;
        }
        plVar20 = (lysp_ext_instance *)((long)&plVar20->name + 1);
        if (plVar9 <= plVar20) {
          iVar14 = 0;
          goto LAB_0014bfbb;
        }
        plVar2 = node[1].module;
        uVar3 = *(ulong *)&plVar2[-1].implemented;
        must_p = (lysp_restr *)((long)&plVar19->parent + lVar17);
        lVar17 = lVar17 + 0x40;
        *(ulong *)&plVar2[-1].implemented = uVar3 + 1;
        LVar7 = lys_compile_must(ctx,must_p,
                                 (lysc_must *)
                                 (&plVar2->ctx + (-(ulong)(plVar2 == (lys_module *)0x0) | uVar3) * 7
                                 ));
        LVar6 = LY_SUCCESS;
      } while (LVar7 == LY_SUCCESS);
      iVar14 = 5;
    }
LAB_0014bfbb:
    if (iVar14 == 5) {
      return LVar7;
    }
    if (iVar14 != 0) {
      return unaff_R15D;
    }
  }
  LVar7 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  if ((node->flags & 1) != 0) {
    plVar15 = node;
    if ((node != (lysc_node *)0x0) && ((ctx->compile_opts & 1) != 0)) {
      do {
        if ((plVar15->flags & 0x800) != 0) goto LAB_0014c021;
        pplVar16 = &plVar15->parent;
        plVar15 = *pplVar16;
      } while (*pplVar16 != (lysc_node *)0x0);
      plVar15 = (lysc_node *)0x0;
    }
LAB_0014c021:
    if ((plVar15 != (lysc_node *)0x0) &&
       ((pnode[1].next == (lysp_node *)0x0 || (*(char *)&(pnode[1].next)->parent == '\0')))) {
      plVar18 = ctx->ctx;
      pcVar10 = "Missing key in list representing configuration data.";
LAB_0014c3bd:
      ly_vlog(plVar18,(char *)0x0,LYVE_SEMANTICS,pcVar10);
      return LY_EVALID;
    }
  }
  if (pnode[1].next == (lysp_node *)0x0) {
    node->flags = node->flags & 0xfd3f | 0x240;
  }
  else {
    plVar15 = (lysc_node *)0x0;
    plVar19 = pnode[1].next;
    do {
      pcVar10 = strpbrk((char *)plVar19," \t\n");
      if (pcVar10 == (char *)0x0) {
        name_len = strlen((char *)plVar19);
        plVar21 = (lysp_node *)0x0;
      }
      else {
        ppuVar11 = __ctype_b_loc();
        plVar21 = (lysp_node *)(pcVar10 + -1);
        do {
          pplVar5 = &plVar21->parent;
          plVar21 = (lysp_node *)((long)&plVar21->parent + 1);
        } while ((*(byte *)((long)*ppuVar11 + (long)*(char *)((long)pplVar5 + 1) * 2 + 1) & 0x20) !=
                 0);
        name_len = (long)pcVar10 - (long)plVar19;
      }
      plVar12 = lys_find_child(node,node->module,(char *)plVar19,name_len,4,2);
      if (plVar12 == (lysc_node *)0x0) {
        plVar18 = ctx->ctx;
        pcVar10 = "The list\'s key \"%.*s\" not found.";
        code = LYVE_REFERENCE;
LAB_0014c322:
        ly_vlog(plVar18,(char *)0x0,code,pcVar10,name_len & 0xffffffff,plVar19);
        return LY_EVALID;
      }
      if ((plVar12->flags & 0x100) != 0) {
        plVar18 = ctx->ctx;
        pcVar10 = "Duplicated key identifier \"%.*s\".";
        code = LYVE_SEMANTICS;
        goto LAB_0014c322;
      }
      lysc_update_path(ctx,node->module,plVar12->name);
      if (((plVar12->flags ^ node->flags) & 3) != 0) {
        plVar18 = ctx->ctx;
        pcVar10 = "Key of a configuration list must not be a state leaf.";
        goto LAB_0014c3bd;
      }
      if (ctx->pmod->version < 2) {
        if (*(int *)&(plVar12[1].parent)->next == 10) {
          plVar18 = ctx->ctx;
          pcVar10 = "List key of the \"empty\" type is allowed only in YANG 1.1 modules.";
          goto LAB_0014c3bd;
        }
      }
      else if (plVar12[1].module != (lys_module *)0x0) {
        plVar18 = ctx->ctx;
        pcVar10 = "List\'s key must not have any \"when\" statement.";
        goto LAB_0014c3bd;
      }
      LVar7 = lysc_check_status(ctx,node->flags,node->module,node->name,plVar12->flags,
                                plVar12->module,plVar12->name);
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
      if (plVar12[1].prev != (lysc_node *)0x0) {
        (**(code **)((plVar12[1].prev)->module->revision + 0x38))(ctx->ctx);
        lysc_type_free(&ctx->free_ctx,(lysc_type *)(plVar12[1].prev)->module);
        free(plVar12[1].prev);
        plVar12[1].prev = (lysc_node *)0x0;
      }
      pbVar1 = (byte *)((long)&plVar12->flags + 1);
      *pbVar1 = *pbVar1 | 1;
      if (plVar15 == (lysc_node *)0x0) {
        if (plVar12->prev->next != (lysc_node *)0x0) goto LAB_0014c1c6;
      }
      else if (plVar15 != plVar12->prev) {
LAB_0014c1c6:
        plVar13 = plVar12->next;
        if (plVar13 == (lysc_node *)0x0) {
          plVar13 = *(lysc_node **)(node + 1);
        }
        plVar13->prev = plVar12->prev;
        if (plVar12->prev->next != (lysc_node *)0x0) {
          plVar12->prev->next = plVar12->next;
        }
        if (plVar15 == (lysc_node *)0x0) {
          plVar12->prev = (*(lysc_node **)(node + 1))->prev;
          plVar13 = node + 1;
        }
        else {
          plVar12->prev = plVar15;
          plVar13 = (lysc_node *)&plVar15->next;
        }
        plVar12->next = *(lysc_node **)plVar13;
        if (plVar15 == (lysc_node *)0x0) {
          pplVar16 = (lysc_node **)(*(long *)(node + 1) + 0x20);
        }
        else {
          plVar13 = plVar15->next;
          if (plVar13 == (lysc_node *)0x0) {
            plVar13 = *(lysc_node **)(node + 1);
          }
          pplVar16 = &plVar15->next;
          plVar13->prev = plVar12;
        }
        *pplVar16 = plVar12;
        if (plVar12->prev->next == (lysc_node *)0x0) {
          *(lysc_node **)(node + 1) = plVar12;
        }
      }
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      plVar15 = plVar12;
      plVar19 = plVar21;
    } while (plVar21 != (lysp_node *)0x0);
  }
  LVar7 = lys_compile_node_augments(ctx,node);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  if ((pnode[2].parent != (lysp_node *)0x0) &&
     (LVar7 = lys_compile_node_list_unique(ctx,(lysp_qname *)pnode[2].parent,(lysc_node_list *)node)
     , LVar7 != LY_SUCCESS)) {
    return LVar7;
  }
  for (plVar19 = (lysp_node *)pnode[1].iffeatures; plVar19 != (lysp_node *)0x0;
      plVar19 = plVar19->next) {
    LVar7 = lys_compile_node(ctx,plVar19,node,0,(ly_set *)0x0);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
  }
  for (plVar20 = pnode[1].exts; plVar20 != (lysp_ext_instance *)0x0;
      plVar20 = *(lysp_ext_instance **)&plVar20->format) {
    LVar7 = lys_compile_node(ctx,(lysp_node *)plVar20,node,0,(ly_set *)0x0);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
  }
  if (*(uint *)((long)&node[1].dsc + 4) < *(uint *)&node[1].dsc) {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
            "List min-elements %u is bigger than max-elements %u.");
    return LY_EVALID;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_node_list(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_list *list_p = (struct lysp_node_list *)pnode;
    struct lysc_node_list *list = (struct lysc_node_list *)node;
    struct lysp_node *child_p;
    struct lysc_node *parent;
    struct lysc_node_leaf *key, *prev_key = NULL;
    size_t len;
    const char *keystr, *delim;
    LY_ERR ret = LY_SUCCESS;

    list->min = list_p->min;
    if (list->min) {
        list->flags |= LYS_MAND_TRUE;
    }
    list->max = list_p->max ? list_p->max : UINT32_MAX;

    LY_LIST_FOR(list_p->child, child_p) {
        LY_CHECK_RET(lys_compile_node(ctx, child_p, node, 0, NULL));
    }

    COMPILE_ARRAY_GOTO(ctx, list_p->musts, list->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* keys */
    if (list->flags & LYS_CONFIG_W) {
        parent = node;
        if (ctx->compile_opts & LYS_COMPILE_GROUPING) {
            /* compiling individual grouping, we can check this only if there is an explicit config set */
            while (parent) {
                if (parent->flags & LYS_SET_CONFIG) {
                    break;
                }
                parent = parent->parent;
            }
        }

        if (parent && (!list_p->key || !list_p->key[0])) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Missing key in list representing configuration data.");
            return LY_EVALID;
        }
    }

    /* find all the keys (must be direct children) */
    keystr = list_p->key;
    if (!keystr) {
        /* keyless list */
        list->flags &= ~LYS_ORDBY_SYSTEM;
        list->flags |= LYS_KEYLESS | LYS_ORDBY_USER;
    }
    while (keystr) {
        delim = strpbrk(keystr, " \t\n");
        if (delim) {
            len = delim - keystr;
            while (isspace(*delim)) {
                ++delim;
            }
        } else {
            len = strlen(keystr);
        }

        /* key node must be present */
        key = (struct lysc_node_leaf *)lys_find_child(node, node->module, keystr, len, LYS_LEAF, LYS_GETNEXT_NOCHOICE);
        if (!key) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "The list's key \"%.*s\" not found.", (int)len, keystr);
            return LY_EVALID;
        }
        /* keys must be unique */
        if (key->flags & LYS_KEY) {
            /* the node was already marked as a key */
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Duplicated key identifier \"%.*s\".", (int)len, keystr);
            return LY_EVALID;
        }

        lysc_update_path(ctx, list->module, key->name);
        /* key must have the same config flag as the list itself */
        if ((list->flags & LYS_CONFIG_MASK) != (key->flags & LYS_CONFIG_MASK)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Key of a configuration list must not be a state leaf.");
            return LY_EVALID;
        }
        if (ctx->pmod->version < LYS_VERSION_1_1) {
            /* YANG 1.0 denies key to be of empty type */
            if (key->type->basetype == LY_TYPE_EMPTY) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "List key of the \"empty\" type is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else {
            /* when and if-feature are illegal on list keys */
            if (key->when) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List's key must not have any \"when\" statement.");
                return LY_EVALID;
            }
            /* unable to check if-features but compilation would fail if disabled */
        }

        /* check status */
        LY_CHECK_RET(lysc_check_status(ctx, list->flags, list->module, list->name, key->flags, key->module, key->name));

        /* ignore default values of the key */
        if (key->dflt) {
            key->dflt->realtype->plugin->free(ctx->ctx, key->dflt);
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)key->dflt->realtype);
            free(key->dflt);
            key->dflt = NULL;
        }
        /* mark leaf as key */
        key->flags |= LYS_KEY;

        /* move it to the correct position */
        if ((prev_key && ((struct lysc_node *)prev_key != key->prev)) || (!prev_key && key->prev->next)) {
            /* fix links in closest previous siblings of the key */
            if (key->next) {
                key->next->prev = key->prev;
            } else {
                /* last child */
                list->child->prev = key->prev;
            }
            if (key->prev->next) {
                key->prev->next = key->next;
            }
            /* fix links in the key */
            if (prev_key) {
                key->prev = &prev_key->node;
                key->next = prev_key->next;
            } else {
                key->prev = list->child->prev;
                key->next = list->child;
            }
            /* fix links in closes future siblings of the key */
            if (prev_key) {
                if (prev_key->next) {
                    prev_key->next->prev = &key->node;
                } else {
                    list->child->prev = &key->node;
                }
                prev_key->next = &key->node;
            } else {
                list->child->prev = &key->node;
            }
            /* fix links in parent */
            if (!key->prev->next) {
                list->child = &key->node;
            }
        }

        /* next key value */
        prev_key = key;
        keystr = delim;
        lysc_update_path(ctx, NULL, NULL);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* uniques */
    if (list_p->uniques) {
        LY_CHECK_RET(lys_compile_node_list_unique(ctx, list_p->uniques, list));
    }

    LY_LIST_FOR((struct lysp_node *)list_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)list_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* checks */
    if (list->min > list->max) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List min-elements %" PRIu32 " is bigger than max-elements %" PRIu32 ".",
                list->min, list->max);
        return LY_EVALID;
    }

done:
    return ret;
}